

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_cas_16_di(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint res;
  uint *compare;
  uint dest;
  uint ea;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar1 = m68ki_read_imm_16();
    uVar3 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
    uVar2 = m68ki_read_imm_16();
    uVar3 = uVar3 + (int)(short)uVar2;
    uVar2 = m68ki_read_16_fc(uVar3,m68ki_cpu.s_flag | m68ki_address_space);
    puVar5 = m68ki_cpu.dar + (uVar1 & 7);
    uVar4 = uVar2 - (*puVar5 & 0xffff);
    m68ki_cpu.n_flag = uVar4 >> 8;
    m68ki_cpu.not_z_flag = uVar4 & 0xffff;
    m68ki_cpu.v_flag = ((*puVar5 ^ uVar2) & (uVar4 ^ uVar2)) >> 8;
    m68ki_cpu.c_flag = uVar4 >> 8;
    if (m68ki_cpu.not_z_flag == 0) {
      m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
      m68ki_write_16_fc(uVar3,m68ki_cpu.s_flag | 1,m68ki_cpu.dar[uVar1 >> 6 & 7] & 0xffff);
    }
    else {
      *puVar5 = *puVar5 & 0xffff0000 | uVar2;
    }
  }
  return;
}

Assistant:

static void m68k_op_cas_16_di(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint ea = EA_AY_DI_16();
		uint dest = m68ki_read_16(ea);
		uint* compare = &REG_D[word2 & 7];
		uint res = dest - MASK_OUT_ABOVE_16(*compare);

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_16(res);
		FLAG_Z = MASK_OUT_ABOVE_16(res);
		FLAG_V = VFLAG_SUB_16(*compare, dest, res);
		FLAG_C = CFLAG_16(res);

		if(COND_NE())
			*compare = MASK_OUT_BELOW_16(*compare) | dest;
		else
		{
			USE_CYCLES(3);
			m68ki_write_16(ea, MASK_OUT_ABOVE_16(REG_D[(word2 >> 6) & 7]));
		}
		return;
	}
	m68ki_exception_illegal();
}